

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.c
# Opt level: O3

int chirc_ctx_add_server(chirc_ctx_t *ctx,chirc_server_t *server)

{
  UT_hash_handle *pUVar1;
  UT_hash_bucket *pUVar2;
  byte bVar3;
  int *piVar4;
  chirc_server_t *pcVar5;
  UT_hash_handle *pUVar6;
  UT_hash_handle *pUVar7;
  UT_hash_handle *pUVar8;
  int iVar9;
  UT_hash_table *pUVar10;
  UT_hash_bucket *__ptr;
  UT_hash_bucket *pUVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  int *piVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  
  piVar4 = (int *)server->servername;
  bVar3 = *(byte *)((long)piVar4 + -1);
  uVar12 = 0xfeedbeef;
  uVar13 = 0x9e3779b9;
  piVar16 = piVar4;
  switch(bVar3 & 7) {
  case 0:
    uVar14 = (ulong)(bVar3 >> 3);
    break;
  case 1:
    uVar14 = (ulong)*(byte *)((long)piVar4 + -3);
    break;
  case 2:
    uVar14 = (ulong)*(ushort *)((long)piVar4 + -5);
    break;
  case 3:
    uVar14 = (ulong)*(uint *)((long)piVar4 + -9);
    break;
  case 4:
    uVar14 = *(ulong *)((long)piVar4 + -0x11);
    break;
  default:
    uVar15 = 0;
    goto LAB_00105d85;
  }
  uVar15 = (uint)uVar14;
  if (uVar15 < 0xc) {
LAB_00105d85:
    uVar17 = 0x9e3779b9;
  }
  else {
    uVar17 = 0x9e3779b9;
    uVar12 = 0xfeedbeef;
    uVar13 = 0x9e3779b9;
    do {
      uVar12 = uVar12 + piVar16[2];
      uVar17 = uVar12 >> 0xd ^ ((uVar17 + *piVar16) - (uVar13 + piVar16[1])) - uVar12;
      uVar15 = uVar17 << 8 ^ ((uVar13 + piVar16[1]) - uVar12) - uVar17;
      uVar13 = uVar15 >> 0xd ^ (uVar12 - uVar17) - uVar15;
      uVar12 = uVar13 >> 0xc ^ (uVar17 - uVar15) - uVar13;
      uVar15 = uVar12 << 0x10 ^ (uVar15 - uVar13) - uVar12;
      uVar18 = uVar15 >> 5 ^ (uVar13 - uVar12) - uVar15;
      uVar17 = uVar18 >> 3 ^ (uVar12 - uVar15) - uVar18;
      uVar13 = uVar17 << 10 ^ (uVar15 - uVar18) - uVar17;
      uVar12 = uVar13 >> 0xf ^ (uVar18 - uVar17) - uVar13;
      piVar16 = piVar16 + 3;
      uVar15 = (int)uVar14 - 0xc;
      uVar14 = (ulong)uVar15;
    } while (0xb < uVar15);
  }
  switch(bVar3 & 7) {
  case 0:
    uVar18 = (uint)(bVar3 >> 3);
    break;
  case 1:
    uVar18 = (uint)*(byte *)((long)piVar4 + -3);
    break;
  case 2:
    uVar18 = (uint)*(ushort *)((long)piVar4 + -5);
    break;
  case 3:
    uVar18 = *(uint *)((long)piVar4 + -9);
    break;
  case 4:
    uVar18 = (uint)*(undefined8 *)((long)piVar4 + -0x11);
    break;
  default:
    uVar18 = 0;
  }
  uVar12 = uVar12 + uVar18;
  if (uVar15 - 1 < 0xb) {
    iVar9 = (*(code *)(&DAT_0010a340 + *(int *)(&DAT_0010a340 + (ulong)(uVar15 - 1) * 4)))
                      (uVar17,piVar16);
    return iVar9;
  }
  uVar15 = uVar12 >> 0xd ^ (uVar17 - uVar13) - uVar12;
  uVar17 = uVar15 << 8 ^ (uVar13 - uVar12) - uVar15;
  uVar13 = uVar17 >> 0xd ^ (uVar12 - uVar15) - uVar17;
  uVar12 = uVar13 >> 0xc ^ (uVar15 - uVar17) - uVar13;
  uVar15 = uVar12 << 0x10 ^ (uVar17 - uVar13) - uVar12;
  uVar13 = uVar15 >> 5 ^ (uVar13 - uVar12) - uVar15;
  uVar12 = uVar13 >> 3 ^ (uVar12 - uVar15) - uVar13;
  uVar15 = uVar12 << 10 ^ (uVar15 - uVar13) - uVar12;
  uVar12 = uVar15 >> 0xf ^ uVar13 - (uVar12 + uVar15);
  (server->hh).hashv = uVar12;
  (server->hh).key = piVar4;
  switch(*(byte *)((long)piVar4 + -1) & 7) {
  case 0:
    uVar13 = (uint)(*(byte *)((long)piVar4 + -1) >> 3);
    break;
  case 1:
    uVar13 = (uint)*(byte *)((long)piVar4 + -3);
    break;
  case 2:
    uVar13 = (uint)*(ushort *)((long)piVar4 + -5);
    break;
  case 3:
    uVar13 = *(uint *)((long)piVar4 + -9);
    break;
  case 4:
    uVar13 = (uint)*(undefined8 *)((long)piVar4 + -0x11);
    break;
  default:
    uVar13 = 0;
  }
  pUVar1 = &server->hh;
  (server->hh).keylen = uVar13;
  pcVar5 = (ctx->network).servers;
  if (pcVar5 == (chirc_server_t *)0x0) {
    pUVar10 = (UT_hash_table *)calloc(1,0x40);
    (server->hh).prev = (void *)0x0;
    (server->hh).next = (void *)0x0;
    (server->hh).tbl = pUVar10;
    if (pUVar10 == (UT_hash_table *)0x0) goto LAB_0010616a;
    pUVar10->tail = pUVar1;
    pUVar10->num_buckets = 0x20;
    pUVar10->log2_num_buckets = 5;
    pUVar10->hho = 0x30;
    __ptr = (UT_hash_bucket *)calloc(1,0x200);
    pUVar10->buckets = __ptr;
    pUVar10->signature = 0xa0111fe1;
    if (__ptr == (UT_hash_bucket *)0x0) goto LAB_0010616a;
    (ctx->network).servers = server;
    uVar13 = 0x20;
  }
  else {
    pUVar10 = (pcVar5->hh).tbl;
    (server->hh).tbl = pUVar10;
    (server->hh).next = (void *)0x0;
    pUVar6 = pUVar10->tail;
    (server->hh).prev = (void *)((long)pUVar6 - pUVar10->hho);
    pUVar6->next = server;
    pUVar10->tail = pUVar1;
    uVar13 = pUVar10->num_buckets;
    __ptr = pUVar10->buckets;
  }
  uVar17 = pUVar10->num_items + 1;
  pUVar10->num_items = uVar17;
  uVar12 = uVar13 - 1 & uVar12;
  uVar15 = __ptr[uVar12].count + 1;
  __ptr[uVar12].count = uVar15;
  pUVar6 = __ptr[uVar12].hh_head;
  (server->hh).hh_next = pUVar6;
  (server->hh).hh_prev = (UT_hash_handle *)0x0;
  if (pUVar6 != (UT_hash_handle *)0x0) {
    pUVar6->hh_prev = pUVar1;
  }
  __ptr[uVar12].hh_head = pUVar1;
  if ((__ptr[uVar12].expand_mult * 10 + 10 <= uVar15) && (pUVar10->noexpand == 0)) {
    pUVar11 = (UT_hash_bucket *)calloc(1,(ulong)uVar13 << 5);
    if (pUVar11 == (UT_hash_bucket *)0x0) {
LAB_0010616a:
      exit(-1);
    }
    uVar12 = uVar13 * 2 - 1;
    uVar15 = ((uVar17 >> ((char)pUVar10->log2_num_buckets + 1U & 0x1f)) + 1) -
             (uint)((uVar12 & uVar17) == 0);
    pUVar10->ideal_chain_maxlen = uVar15;
    pUVar10->nonideal_items = 0;
    if (uVar13 != 0) {
      uVar17 = 0;
      uVar14 = 0;
      do {
        pUVar6 = __ptr[uVar14].hh_head;
        while (pUVar6 != (UT_hash_handle *)0x0) {
          pUVar7 = pUVar6->hh_next;
          uVar19 = pUVar6->hashv & uVar12;
          pUVar2 = pUVar11 + uVar19;
          uVar18 = pUVar11[uVar19].count + 1;
          pUVar11[uVar19].count = uVar18;
          if (uVar15 < uVar18) {
            uVar17 = uVar17 + 1;
            pUVar10->nonideal_items = uVar17;
            if (pUVar2->expand_mult * uVar15 < uVar18) {
              pUVar2->expand_mult = pUVar2->expand_mult + 1;
            }
          }
          pUVar6->hh_prev = (UT_hash_handle *)0x0;
          pUVar8 = pUVar2->hh_head;
          pUVar6->hh_next = pUVar8;
          if (pUVar8 != (UT_hash_handle *)0x0) {
            pUVar8->hh_prev = pUVar6;
          }
          pUVar2->hh_head = pUVar6;
          pUVar6 = pUVar7;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar13);
    }
    free(__ptr);
    pUVar10 = pUVar1->tbl;
    pUVar10->num_buckets = pUVar10->num_buckets << 1;
    pUVar10->log2_num_buckets = pUVar10->log2_num_buckets + 1;
    pUVar10->buckets = pUVar11;
    if (pUVar10->num_items >> 1 < pUVar10->nonideal_items) {
      uVar12 = pUVar10->ineff_expands + 1;
      pUVar10->ineff_expands = uVar12;
      if (1 < uVar12) {
        pUVar10->noexpand = 1;
      }
    }
    else {
      pUVar10->ineff_expands = 0;
    }
  }
  return 0;
}

Assistant:

int chirc_ctx_add_server(chirc_ctx_t *ctx, chirc_server_t *server)
{
    HASH_ADD_KEYPTR(hh, ctx->network.servers, server->servername, sdslen(server->servername), server);

    return CHIRC_OK;
}